

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ImGuiKey toImGuiKey(int32_t keyCode)

{
  int32_t keyCode_local;
  ImGuiKey local_4;
  
  switch(keyCode) {
  case 8:
    local_4 = 0x20b;
    break;
  case 9:
    local_4 = 0x200;
    break;
  default:
    local_4 = 0x285;
    break;
  case 0xd:
    local_4 = 0x20d;
    break;
  case 0x10:
    local_4 = 0x282;
    break;
  case 0x11:
    local_4 = 0x281;
    break;
  case 0x12:
    local_4 = 0x283;
    break;
  case 0x13:
    local_4 = 599;
    break;
  case 0x14:
    local_4 = 0x253;
    break;
  case 0x1b:
    local_4 = 0x20e;
    break;
  case 0x20:
    local_4 = 0x20c;
    break;
  case 0x21:
    local_4 = 0x205;
    break;
  case 0x22:
    local_4 = 0x206;
    break;
  case 0x23:
    local_4 = 0x208;
    break;
  case 0x24:
    local_4 = 0x207;
    break;
  case 0x25:
    local_4 = 0x201;
    break;
  case 0x26:
    local_4 = 0x203;
    break;
  case 0x27:
    local_4 = 0x202;
    break;
  case 0x28:
    local_4 = 0x204;
    break;
  case 0x2d:
    local_4 = 0x209;
    break;
  case 0x2e:
    local_4 = 0x20a;
    break;
  case 0x30:
    local_4 = 0x218;
    break;
  case 0x31:
    local_4 = 0x219;
    break;
  case 0x32:
    local_4 = 0x21a;
    break;
  case 0x33:
    local_4 = 0x21b;
    break;
  case 0x34:
    local_4 = 0x21c;
    break;
  case 0x35:
    local_4 = 0x21d;
    break;
  case 0x36:
    local_4 = 0x21e;
    break;
  case 0x37:
    local_4 = 0x21f;
    break;
  case 0x38:
    local_4 = 0x220;
    break;
  case 0x39:
    local_4 = 0x221;
    break;
  case 0x41:
    local_4 = 0x222;
    break;
  case 0x42:
    local_4 = 0x223;
    break;
  case 0x43:
    local_4 = 0x224;
    break;
  case 0x44:
    local_4 = 0x225;
    break;
  case 0x45:
    local_4 = 0x226;
    break;
  case 0x46:
    local_4 = 0x227;
    break;
  case 0x47:
    local_4 = 0x228;
    break;
  case 0x48:
    local_4 = 0x229;
    break;
  case 0x49:
    local_4 = 0x22a;
    break;
  case 0x4a:
    local_4 = 0x22b;
    break;
  case 0x4b:
    local_4 = 0x22c;
    break;
  case 0x4c:
    local_4 = 0x22d;
    break;
  case 0x4d:
    local_4 = 0x22e;
    break;
  case 0x4e:
    local_4 = 0x22f;
    break;
  case 0x4f:
    local_4 = 0x230;
    break;
  case 0x50:
    local_4 = 0x231;
    break;
  case 0x51:
    local_4 = 0x232;
    break;
  case 0x52:
    local_4 = 0x233;
    break;
  case 0x53:
    local_4 = 0x234;
    break;
  case 0x54:
    local_4 = 0x235;
    break;
  case 0x55:
    local_4 = 0x236;
    break;
  case 0x56:
    local_4 = 0x237;
    break;
  case 0x57:
    local_4 = 0x238;
    break;
  case 0x58:
    local_4 = 0x239;
    break;
  case 0x59:
    local_4 = 0x23a;
    break;
  case 0x5a:
    local_4 = 0x23b;
    break;
  case 0x5b:
    local_4 = 0x284;
    break;
  case 0x5c:
    local_4 = 0x284;
    break;
  case 0x5d:
    local_4 = 0x284;
    break;
  case 0x60:
    local_4 = 600;
    break;
  case 0x61:
    local_4 = 0x259;
    break;
  case 0x62:
    local_4 = 0x25a;
    break;
  case 99:
    local_4 = 0x25b;
    break;
  case 100:
    local_4 = 0x25c;
    break;
  case 0x65:
    local_4 = 0x25d;
    break;
  case 0x66:
    local_4 = 0x25e;
    break;
  case 0x67:
    local_4 = 0x25f;
    break;
  case 0x68:
    local_4 = 0x260;
    break;
  case 0x69:
    local_4 = 0x261;
    break;
  case 0x6a:
    local_4 = 0x264;
    break;
  case 0x6b:
    local_4 = 0x266;
    break;
  case 0x6c:
    local_4 = 0x267;
    break;
  case 0x6d:
    local_4 = 0x265;
    break;
  case 0x6e:
    local_4 = 0x262;
    break;
  case 0x6f:
    local_4 = 0x263;
    break;
  case 0x70:
    local_4 = 0x23c;
    break;
  case 0x71:
    local_4 = 0x23d;
    break;
  case 0x72:
    local_4 = 0x23e;
    break;
  case 0x73:
    local_4 = 0x23f;
    break;
  case 0x74:
    local_4 = 0x240;
    break;
  case 0x75:
    local_4 = 0x241;
    break;
  case 0x76:
    local_4 = 0x242;
    break;
  case 0x77:
    local_4 = 0x243;
    break;
  case 0x78:
    local_4 = 0x244;
    break;
  case 0x79:
    local_4 = 0x245;
    break;
  case 0x7a:
    local_4 = 0x246;
    break;
  case 0x7b:
    local_4 = 0x247;
    break;
  case 0x90:
    local_4 = 0x255;
    break;
  case 0x91:
    local_4 = 0x254;
    break;
  case 0xba:
    local_4 = 0x24d;
    break;
  case 0xbb:
    local_4 = 0x24e;
    break;
  case 0xbc:
    local_4 = 0x249;
    break;
  case 0xbd:
    local_4 = 0x24a;
    break;
  case 0xbe:
    local_4 = 0x24b;
    break;
  case 0xbf:
    local_4 = 0x24c;
    break;
  case 0xdb:
    local_4 = 0x24f;
    break;
  case 0xdc:
    local_4 = 0x250;
    break;
  case 0xdd:
    local_4 = 0x251;
    break;
  case 0xde:
    local_4 = 0x248;
  }
  return local_4;
}

Assistant:

ImGuiKey toImGuiKey(int32_t keyCode) {
    switch (keyCode) {
        case 8: return ImGuiKey_Backspace;
        case 9: return ImGuiKey_Tab;
        case 13: return ImGuiKey_Enter;
        case 16: return ImGuiKey_ModShift;
        case 17: return ImGuiKey_ModCtrl;
        case 18: return ImGuiKey_ModAlt;
        case 19: return ImGuiKey_Pause;
        case 20: return ImGuiKey_CapsLock;
        case 27: return ImGuiKey_Escape;
        case 32: return ImGuiKey_Space;
        case 33: return ImGuiKey_PageUp;
        case 34: return ImGuiKey_PageDown;
        case 35: return ImGuiKey_End;
        case 36: return ImGuiKey_Home;
        case 37: return ImGuiKey_LeftArrow;
        case 38: return ImGuiKey_UpArrow;
        case 39: return ImGuiKey_RightArrow;
        case 40: return ImGuiKey_DownArrow;
        case 45: return ImGuiKey_Insert;
        case 46: return ImGuiKey_Delete;
        case 48: return ImGuiKey_0;
        case 49: return ImGuiKey_1;
        case 50: return ImGuiKey_2;
        case 51: return ImGuiKey_3;
        case 52: return ImGuiKey_4;
        case 53: return ImGuiKey_5;
        case 54: return ImGuiKey_6;
        case 55: return ImGuiKey_7;
        case 56: return ImGuiKey_8;
        case 57: return ImGuiKey_9;
        case 65: return ImGuiKey_A;
        case 66: return ImGuiKey_B;
        case 67: return ImGuiKey_C;
        case 68: return ImGuiKey_D;
        case 69: return ImGuiKey_E;
        case 70: return ImGuiKey_F;
        case 71: return ImGuiKey_G;
        case 72: return ImGuiKey_H;
        case 73: return ImGuiKey_I;
        case 74: return ImGuiKey_J;
        case 75: return ImGuiKey_K;
        case 76: return ImGuiKey_L;
        case 77: return ImGuiKey_M;
        case 78: return ImGuiKey_N;
        case 79: return ImGuiKey_O;
        case 80: return ImGuiKey_P;
        case 81: return ImGuiKey_Q;
        case 82: return ImGuiKey_R;
        case 83: return ImGuiKey_S;
        case 84: return ImGuiKey_T;
        case 85: return ImGuiKey_U;
        case 86: return ImGuiKey_V;
        case 87: return ImGuiKey_W;
        case 88: return ImGuiKey_X;
        case 89: return ImGuiKey_Y;
        case 90: return ImGuiKey_Z;

        //case 91: return ImGuiKey_LWin;
        //case 92: return ImGuiKey_RWin;
        //case 93: return ImGuiKey_Apps;
        case 91: return ImGuiKey_ModSuper;
        case 92: return ImGuiKey_ModSuper;
        case 93: return ImGuiKey_ModSuper;

        case 96: return ImGuiKey_Keypad0;
        case 97: return ImGuiKey_Keypad1;
        case 98: return ImGuiKey_Keypad2;
        case 99: return ImGuiKey_Keypad3;
        case 100: return ImGuiKey_Keypad4;
        case 101: return ImGuiKey_Keypad5;
        case 102: return ImGuiKey_Keypad6;
        case 103: return ImGuiKey_Keypad7;
        case 104: return ImGuiKey_Keypad8;
        case 105: return ImGuiKey_Keypad9;
        case 106: return ImGuiKey_KeypadMultiply;
        case 107: return ImGuiKey_KeypadAdd;
        case 108: return ImGuiKey_KeypadEnter;
        case 109: return ImGuiKey_KeypadSubtract;
        case 110: return ImGuiKey_KeypadDecimal;
        case 111: return ImGuiKey_KeypadDivide;
        case 112: return ImGuiKey_F1;
        case 113: return ImGuiKey_F2;
        case 114: return ImGuiKey_F3;
        case 115: return ImGuiKey_F4;
        case 116: return ImGuiKey_F5;
        case 117: return ImGuiKey_F6;
        case 118: return ImGuiKey_F7;
        case 119: return ImGuiKey_F8;
        case 120: return ImGuiKey_F9;
        case 121: return ImGuiKey_F10;
        case 122: return ImGuiKey_F11;
        case 123: return ImGuiKey_F12;
        case 144: return ImGuiKey_NumLock;
        case 145: return ImGuiKey_ScrollLock;
        case 186: return ImGuiKey_Semicolon;
        case 187: return ImGuiKey_Equal;
        case 188: return ImGuiKey_Comma;
        case 189: return ImGuiKey_Minus;
        case 190: return ImGuiKey_Period;
        case 191: return ImGuiKey_Slash;
        case 219: return ImGuiKey_LeftBracket;
        case 220: return ImGuiKey_Backslash;
        case 221: return ImGuiKey_RightBracket;
        case 222: return ImGuiKey_Apostrophe;
        default: return ImGuiKey_COUNT;
    }

    return ImGuiKey_COUNT;
}